

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_phys.c
# Opt level: O0

REF_STATUS ref_phys_minspac(REF_DBL reynolds_number,REF_DBL *yplus1)

{
  double dVar1;
  double dVar2;
  double local_50;
  double local_40;
  double local_38;
  double local_30;
  REF_DBL cf;
  REF_DBL *yplus1_local;
  REF_DBL reynolds_number_local;
  
  *yplus1 = -1.0;
  if (0.0 < reynolds_number * 0.06) {
    dVar1 = log(reynolds_number * 0.06);
    dVar1 = pow(dVar1,2.0);
    if (dVar1 * 1e+20 <= 0.0) {
      dVar1 = log(reynolds_number * 0.06);
      dVar1 = pow(dVar1,2.0);
      local_30 = -(dVar1 * 1e+20);
    }
    else {
      dVar1 = log(reynolds_number * 0.06);
      local_30 = pow(dVar1,2.0);
      local_30 = local_30 * 1e+20;
    }
    if (0.445 < local_30) {
      dVar1 = log(reynolds_number * 0.06);
      dVar1 = pow(dVar1,2.0);
      dVar1 = 0.455 / dVar1;
      if (dVar1 * 1e+20 <= 0.0) {
        local_38 = -(dVar1 * 1e+20);
      }
      else {
        local_38 = dVar1 * 1e+20;
      }
      if (2.0 < local_38) {
        if (reynolds_number * 1e+20 <= 0.0) {
          local_40 = -(reynolds_number * 1e+20);
        }
        else {
          local_40 = reynolds_number * 1e+20;
        }
        dVar2 = sqrt(2.0 / dVar1);
        if (dVar2 <= 0.0) {
          local_50 = sqrt(2.0 / dVar1);
          local_50 = -local_50;
        }
        else {
          local_50 = sqrt(2.0 / dVar1);
        }
        if (local_50 < local_40) {
          dVar1 = sqrt(2.0 / dVar1);
          *yplus1 = dVar1 / reynolds_number;
          reynolds_number_local._4_4_ = 0;
        }
        else {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",
                 0x567,"ref_phys_minspac","can not invert reynolds_number for yplus1");
          reynolds_number_local._4_4_ = 1;
        }
      }
      else {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",
               0x565,"ref_phys_minspac","can not invert cf");
        reynolds_number_local._4_4_ = 1;
      }
    }
    else {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",0x563,
             "ref_phys_minspac","can not invert for cf");
      reynolds_number_local._4_4_ = 1;
    }
  }
  else {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",0x561,
           "ref_phys_minspac","expected positive reynolds_number");
    reynolds_number_local._4_4_ = 1;
  }
  return reynolds_number_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_phys_minspac(REF_DBL reynolds_number, REF_DBL *yplus1) {
  REF_DBL cf;
  *yplus1 = -1.0;
  /* laminar: 1.0 / ( sqrt(reynolds_number) *20.0 ); */
  RAS(0.06 * reynolds_number > 0, "expected positive reynolds_number");
  RAS(ref_math_divisible(0.445, pow(log(0.06 * reynolds_number), 2)),
      "can not invert for cf");
  cf = 0.455 / pow(log(0.06 * reynolds_number), 2);
  RAS(ref_math_divisible(2.0, cf), "can not invert cf");
  RAS(ref_math_divisible(sqrt(2.0 / cf), reynolds_number),
      "can not invert reynolds_number for yplus1");

  *yplus1 = sqrt(2.0 / cf) / reynolds_number;
  return REF_SUCCESS;
}